

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binstrcaseless(bstring b1,int pos,bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  __int32_t **pp_Var7;
  uint uVar8;
  long lVar9;
  uchar *puVar10;
  
  if ((((b1 != (bstring)0x0) && (puVar10 = b1->data, puVar10 != (uchar *)0x0)) &&
      (uVar3 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar3)) &&
     ((puVar5 = b2->data, puVar5 != (uchar *)0x0 && (iVar4 = b2->slen, -1 < iVar4)))) {
    if (uVar3 == pos) {
      return -(uint)(iVar4 != 0) | pos;
    }
    if ((uint)pos <= uVar3) {
      if (iVar4 == 0) {
        return pos;
      }
      if (pos <= (int)(uVar3 - iVar4)) {
        if (pos == 0 && puVar10 == puVar5) {
          return 0;
        }
        puVar10 = puVar10 + pos;
LAB_0010fef5:
        lVar9 = 0;
        do {
          bVar1 = puVar5[lVar9];
          uVar6 = (uint)bVar1;
          bVar2 = puVar10[lVar9];
          uVar8 = (uint)bVar2;
          if (bVar1 != bVar2) {
            if (-1 < (char)bVar1) {
              pp_Var7 = __ctype_tolower_loc();
              uVar6 = (*pp_Var7)[bVar1];
            }
            if (-1 < (char)bVar2) {
              pp_Var7 = __ctype_tolower_loc();
              uVar8 = (*pp_Var7)[bVar2];
            }
            if (uVar6 != uVar8) goto LAB_0010ff4f;
          }
          lVar9 = lVar9 + 1;
          if (iVar4 <= (int)lVar9) {
            return pos;
          }
        } while( true );
      }
    }
  }
  return -1;
LAB_0010ff4f:
  if ((int)(uVar3 - iVar4) <= pos) {
    return -1;
  }
  pos = pos + 1;
  puVar10 = puVar10 + 1;
  goto LAB_0010fef5;
}

Assistant:

int binstrcaseless (const bstring b1, int pos, const bstring b2) {
int j, i, l, ll;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	l = b1->slen - b2->slen + 1;

	/* No space to find such a string? */
	if (l <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return 0;

	i = pos;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= ll) return i;
		} else {
			i ++;
			if (i >= l) break;
			j=0;
		}
	}

	return BSTR_ERR;
}